

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::setArchName(Triple *this,StringRef Str)

{
  StringRef SVar1;
  SmallString<64U> Triple;
  Twine local_90;
  SmallVectorImpl<char> local_78;
  undefined1 local_68 [64];
  
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_68;
  SmallVectorImpl<char>::append<char_const*,void>(&local_78,Str.Data,Str.Data + Str.Length);
  SmallVectorImpl<char>::append<char_const*,void>(&local_78,"-","");
  SVar1 = getVendorName(this);
  SmallVectorImpl<char>::append<char_const*,void>(&local_78,SVar1.Data,SVar1.Data + SVar1.Length);
  SmallVectorImpl<char>::append<char_const*,void>(&local_78,"-","");
  SVar1 = getOSAndEnvironmentName(this);
  SmallVectorImpl<char>::append<char_const*,void>(&local_78,SVar1.Data,SVar1.Data + SVar1.Length);
  Twine::Twine(&local_90,&local_78);
  setTriple(this,&local_90);
  if ((undefined1 *)
      local_78.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_68) {
    free(local_78.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void Triple::setArchName(StringRef Str) {
  // Work around a miscompilation bug for Twines in gcc 4.0.3.
  SmallString<64> Triple;
  Triple += Str;
  Triple += "-";
  Triple += getVendorName();
  Triple += "-";
  Triple += getOSAndEnvironmentName();
  setTriple(Triple);
}